

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_LineAttack(FParser *this)

{
  bool bVar1;
  int damage_00;
  AActor *t1;
  double other;
  FName local_60;
  FName local_5c;
  TAngle<double> local_58;
  TAngle<double> local_50;
  TAngle<double> local_48;
  undefined1 local_40 [16];
  TAngle<double> local_30;
  DAngle slope;
  DAngle angle;
  int damage;
  AActor *mo;
  FParser *this_local;
  
  TAngle<double>::TAngle(&slope);
  TAngle<double>::TAngle(&local_30);
  bVar1 = CheckArgs(this,3);
  if (bVar1) {
    t1 = actorvalue(this->t_argv);
    damage_00 = intvalue(this->t_argv + 2);
    other = floatvalue(this->t_argv + 1);
    TAngle<double>::operator=(&slope,other);
    TAngle<double>::TAngle((TAngle<double> *)local_40,&slope);
    TAngle<double>::TAngle(&local_48,0.0);
    P_AimLineAttack((AActor *)(local_40 + 8),(DAngle *)t1,2048.0,(FTranslatedLineTarget *)local_40,
                    (DAngle *)0x0,(int)&local_48,(AActor *)0x0,(AActor *)0x0);
    TAngle<double>::operator=(&local_30,(TAngle<double> *)(local_40 + 8));
    TAngle<double>::TAngle(&local_50,&slope);
    TAngle<double>::TAngle(&local_58,&local_30);
    FName::FName(&local_5c,NAME_Hitscan);
    FName::FName(&local_60,NAME_BulletPuff);
    P_LineAttack(t1,&local_50,2048.0,&local_58,damage_00,&local_5c,&local_60,0,
                 (FTranslatedLineTarget *)0x0,(int *)0x0);
  }
  return;
}

Assistant:

void FParser::SF_LineAttack()
{
	AActor	*mo;
	int		damage;
	DAngle angle, slope;

	if (CheckArgs(3))
	{
		mo = actorvalue(t_argv[0]);
		damage = intvalue(t_argv[2]);

		angle = floatvalue(t_argv[1]);
		slope = P_AimLineAttack(mo, angle, MISSILERANGE);

		P_LineAttack(mo, angle, MISSILERANGE, slope, damage, NAME_Hitscan, NAME_BulletPuff);
	}
}